

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_naive_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowNaiveState::Evaluate
          (WindowNaiveState *this,WindowAggregatorGlobalState *gsink,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  SubFrames *this_00;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_01;
  DataChunk *payload;
  WindowExcludeMode WVar1;
  ulong uVar2;
  data_ptr_t pdVar3;
  bool *pbVar4;
  pointer pFVar5;
  sel_t *psVar6;
  aggregate_destructor_t p_Var7;
  idx_t iVar8;
  undefined8 uVar9;
  Vector *pVVar10;
  pointer pWVar11;
  const_reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  pointer pCVar15;
  pointer pRVar16;
  FunctionDataWrapper *pFVar17;
  DataChunk *this_02;
  ulong uVar18;
  idx_t iVar19;
  ulong uVar20;
  unsigned_long end;
  ulong uVar21;
  size_type __n;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_03;
  FrameBounds *frame;
  pointer pFVar22;
  idx_t iVar23;
  unsigned_long begin;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_true>,_bool> pVar24;
  SubFrames *__range3;
  unsigned_long f;
  PayloadScanner scanner;
  EqualRow equal_row;
  HashRow hash_row;
  vector<duckdb::LogicalType,_true> types;
  RowSet row_set;
  LocalSortState local_sort;
  AggregateInputData aggr_input_data;
  ulong local_4f0;
  ulong local_4e0;
  SelectionVector *local_4d8;
  undefined1 local_4d0 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_4b8;
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_4b0;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_4a8;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_4a0;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
  *local_490;
  data_ptr_t local_488;
  data_ptr_t local_480;
  Vector *local_478;
  data_ptr_t local_470;
  data_ptr_t local_468;
  RowLayout *local_460;
  AggregateFunction *local_458;
  data_ptr_t local_450;
  data_ptr_t local_448;
  data_ptr_t local_440;
  pointer local_438;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_430;
  key_equal local_428;
  HashRow local_420;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_418;
  undefined1 local_400 [280];
  undefined1 local_2e8 [592];
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_98;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  local_90;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_78 [3];
  
  this_03 = &(this->super_WindowAggregatorLocalState).cursor;
  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
            operator->(this_03);
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_418,&pWVar11->chunk);
  local_450 = (this->statef).data;
  local_488 = (this->statep).data;
  local_428.state = this;
  local_420.state = this;
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)local_400,0x800,&local_420,&local_428,(allocator_type *)local_2e8);
  WVar1 = (this->aggregator->super_WindowAggregator).exclude_mode;
  local_478 = result;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  local_440 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  local_448 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  local_468 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  if (count != 0) {
    local_458 = &(gsink->aggr).function;
    this_00 = &this->frames;
    local_470 = pvVar12->data;
    local_490 = (vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
                 *)(local_2e8 + 0x238);
    this_02 = &this->orderby_sort;
    this_01 = &this->arg_orderer;
    local_460 = &this->payload_layout;
    payload = &this->orderby_payload;
    local_4d8 = &this->orderby_sel;
    iVar19 = 0;
    local_4f0 = row_idx;
    do {
      uVar21 = *(ulong *)(local_440 + iVar19 * 8);
      uVar2 = *(ulong *)(local_448 + iVar19 * 8);
      if (WVar1 == NO_OTHER) {
        pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](this_00,0);
      }
      else {
        uVar18 = local_4f0;
        if (WVar1 != CURRENT_ROW) {
          uVar18 = *(ulong *)(local_468 + iVar19 * 8);
        }
        pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](this_00,0);
        if (uVar2 <= uVar18) {
          uVar18 = uVar2;
        }
        if (uVar18 <= uVar21) {
          uVar18 = uVar21;
        }
        pvVar13->start = uVar21;
        pvVar13->end = uVar18;
        __n = 1;
        if (WVar1 == TIES) {
          pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](this_00,1);
          uVar18 = local_4f0 + 1;
          if (uVar2 <= local_4f0 + 1) {
            uVar18 = uVar2;
          }
          if (uVar18 <= uVar21) {
            uVar18 = uVar21;
          }
          uVar20 = uVar21;
          if (uVar21 < local_4f0) {
            uVar20 = local_4f0;
          }
          if (uVar2 <= uVar20) {
            uVar20 = uVar2;
          }
          pvVar13->start = uVar20;
          pvVar13->end = uVar18;
          __n = 2;
        }
        if (WVar1 == CURRENT_ROW) {
          uVar18 = local_4f0 + 1;
        }
        else {
          uVar18 = *(ulong *)(local_470 + iVar19 * 8);
        }
        pvVar13 = vector<duckdb::FrameBounds,_true>::operator[](this_00,__n);
        if (uVar21 < uVar18) {
          uVar21 = uVar18;
        }
        if (uVar2 <= uVar21) {
          uVar21 = uVar2;
        }
      }
      pvVar13->start = uVar21;
      pvVar13->end = uVar2;
      local_480 = *(data_ptr_t *)(local_450 + iVar19 * 8);
      (*(gsink->aggr).function.initialize)(local_458,local_480);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_400);
      if ((this_01->
          super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)._M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0)
      {
        pFVar5 = (this->frames).
                 super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pFVar22 = (this->frames).
                       super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                       super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                       ._M_impl.super__Vector_impl_data._M_start; pFVar22 != pFVar5;
            pFVar22 = pFVar22 + 1) {
          for (local_400._72_8_ = pFVar22->start; (ulong)local_400._72_8_ < pFVar22->end;
              local_400._72_8_ = local_400._72_8_ + 1) {
            pbVar4 = (gsink->filter_mask).validity_mask;
            if ((pbVar4 == (bool *)0x0) || (pbVar4[local_400._72_8_] == true)) {
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_03);
              if (((pWVar11->state).next_row_index <= (ulong)local_400._72_8_) ||
                 ((ulong)local_400._72_8_ < (pWVar11->state).current_row_index)) {
                FlushStates(this,gsink);
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_03);
                uVar9 = local_400._72_8_;
                if (((pWVar11->state).next_row_index <= (ulong)local_400._72_8_) ||
                   ((ulong)local_400._72_8_ < (pWVar11->state).current_row_index)) {
                  pCVar15 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                            ::operator->(&pWVar11->paged->inputs);
                  ColumnDataCollection::Seek(pCVar15,uVar9,&pWVar11->state,&pWVar11->chunk);
                }
              }
              if ((gsink->aggr).aggr_type == DISTINCT) {
                local_2e8._0_8_ = local_400;
                pVar24 = ::std::
                         _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         ::
                         _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,true>>>>
                                   ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                     *)local_2e8._0_8_,local_400 + 0x48,local_2e8);
                if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                goto LAB_011c57dc;
              }
              *(data_ptr_t *)(local_488 + this->flush_count * 8) = local_480;
              pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                        ::operator->(this_03);
              iVar8 = (pWVar11->state).current_row_index;
              psVar6 = (this->update_sel).sel_vector;
              iVar23 = this->flush_count;
              uVar21 = iVar23 + 1;
              this->flush_count = uVar21;
              psVar6[iVar23] = local_400._72_4_ - (int)iVar8;
              if (0x7ff < uVar21) {
                FlushStates(this,gsink);
              }
            }
LAB_011c57dc:
          }
        }
      }
      else {
        GlobalSortState::GlobalSortState
                  ((GlobalSortState *)local_2e8,
                   (this->aggregator->executor->super_WindowExecutor).context,
                   &((this->aggregator->super_WindowAggregator).wexpr)->arg_orders,local_460);
        LocalSortState::LocalSortState((LocalSortState *)(local_400 + 0x48));
        LocalSortState::Initialize
                  ((LocalSortState *)(local_400 + 0x48),(GlobalSortState *)local_2e8,
                   (BufferManager *)local_2e8._48_8_);
        pvVar14 = vector<duckdb::Vector,_true>::operator[](&payload->data,0);
        pFVar22 = (this->frames).
                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_438 = (this->frames).
                    super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (pFVar22 == local_438) {
          iVar23 = 0;
        }
        else {
          pdVar3 = pvVar14->data;
          iVar23 = 0;
          do {
            for (uVar21 = pFVar22->start; uVar21 < pFVar22->end; uVar21 = uVar21 + 1) {
              pbVar4 = (gsink->filter_mask).validity_mask;
              if ((pbVar4 == (bool *)0x0) || (pbVar4[uVar21] == true)) {
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_01);
                if ((uVar21 < (pWVar11->state).current_row_index ||
                    (pWVar11->state).next_row_index <= uVar21) || 0x7ff < iVar23) {
                  if (iVar23 != 0) {
                    pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                              ::operator->(this_01);
                    DataChunk::Reference(this_02,&pWVar11->chunk);
                    DataChunk::Slice(this_02,local_4d8,iVar23);
                    (this->orderby_payload).count = iVar23;
                    LocalSortState::SinkChunk((LocalSortState *)(local_400 + 0x48),this_02,payload);
                  }
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_01);
                  if (((pWVar11->state).next_row_index <= uVar21) ||
                     (uVar21 < (pWVar11->state).current_row_index)) {
                    pCVar15 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              ::operator->(&pWVar11->paged->inputs);
                    ColumnDataCollection::Seek(pCVar15,uVar21,&pWVar11->state,&pWVar11->chunk);
                  }
                  iVar23 = 0;
                }
                *(ulong *)(pdVar3 + iVar23 * 8) = uVar21;
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_01);
                local_4d8->sel_vector[iVar23] =
                     (int)uVar21 - (int)(pWVar11->state).current_row_index;
                iVar23 = iVar23 + 1;
              }
            }
            pFVar22 = pFVar22 + 1;
          } while (pFVar22 != local_438);
        }
        if (iVar23 != 0) {
          pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator->(this_01);
          DataChunk::Reference(this_02,&pWVar11->chunk);
          DataChunk::Slice(this_02,local_4d8,iVar23);
          (this->orderby_payload).count = iVar23;
          LocalSortState::SinkChunk((LocalSortState *)(local_400 + 0x48),this_02,payload);
        }
        GlobalSortState::AddLocalState
                  ((GlobalSortState *)local_2e8,(LocalSortState *)(local_400 + 0x48));
        if (local_2e8._544_8_ != local_2e8._552_8_) {
          GlobalSortState::PrepareMergePhase((GlobalSortState *)local_2e8);
          uVar21 = local_2e8._552_8_ - local_2e8._544_8_;
          while (8 < uVar21) {
            GlobalSortState::InitializeMergeRound((GlobalSortState *)local_2e8);
            MergeSorter::MergeSorter
                      ((MergeSorter *)local_4d0,(GlobalSortState *)local_2e8,
                       (BufferManager *)local_2e8._48_8_);
            MergeSorter::PerformInMergeRound((MergeSorter *)local_4d0);
            GlobalSortState::CompleteMergeRound((GlobalSortState *)local_2e8,false);
            if ((_Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)
                local_4a0._M_head_impl != (SortedBlock *)0x0) {
              ::std::default_delete<duckdb::SortedBlock>::operator()
                        ((default_delete<duckdb::SortedBlock> *)&local_4a0,local_4a0._M_head_impl);
            }
            local_4a0._M_head_impl = (SortedBlock *)0x0;
            if (local_4a8._M_head_impl != (SortedBlock *)0x0) {
              ::std::default_delete<duckdb::SortedBlock>::operator()
                        ((default_delete<duckdb::SortedBlock> *)&local_4a8,local_4a8._M_head_impl);
            }
            local_4a8._M_head_impl = (SortedBlock *)0x0;
            if (local_4b0._M_head_impl != (SBScanState *)0x0) {
              ::std::default_delete<duckdb::SBScanState>::operator()
                        ((default_delete<duckdb::SBScanState> *)&local_4b0,local_4b0._M_head_impl);
            }
            local_4b0._M_head_impl = (SBScanState *)0x0;
            if (local_4b8._M_head_impl != (SBScanState *)0x0) {
              ::std::default_delete<duckdb::SBScanState>::operator()
                        ((default_delete<duckdb::SBScanState> *)&local_4b8,local_4b8._M_head_impl);
            }
            uVar21 = local_2e8._552_8_ - local_2e8._544_8_;
          }
          PayloadScanner::PayloadScanner
                    ((PayloadScanner *)local_4d0,(GlobalSortState *)local_2e8,true);
          while (pRVar16 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                           ::operator->((unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                                         *)(local_4d0 + 0x10)), uVar9 = local_4d0._16_8_,
                pRVar16->total_count != pRVar16->total_scanned) {
            DataChunk::Reset(payload);
            PayloadScanner::Scan((PayloadScanner *)local_4d0,payload);
            pvVar14 = vector<duckdb::Vector,_true>::operator[](&payload->data,0);
            if ((this->orderby_payload).count != 0) {
              pdVar3 = pvVar14->data;
              uVar21 = 0;
              do {
                local_4e0 = *(ulong *)(pdVar3 + uVar21 * 8);
                pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                          ::operator->(this_03);
                if (((pWVar11->state).next_row_index <= local_4e0) ||
                   (local_4e0 < (pWVar11->state).current_row_index)) {
                  FlushStates(this,gsink);
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_03);
                  uVar2 = local_4e0;
                  if (((pWVar11->state).next_row_index <= local_4e0) ||
                     (local_4e0 < (pWVar11->state).current_row_index)) {
                    pCVar15 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                              ::operator->(&pWVar11->paged->inputs);
                    ColumnDataCollection::Seek(pCVar15,uVar2,&pWVar11->state,&pWVar11->chunk);
                  }
                }
                if ((gsink->aggr).aggr_type == DISTINCT) {
                  local_430 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_400;
                  pVar24 = ::std::
                           _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           ::
                           _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,true>>>>
                                     ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,duckdb::WindowNaiveState::EqualRow,duckdb::WindowNaiveState::HashRow,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                       *)local_430,&local_4e0,&local_430);
                  if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  goto LAB_011c5a7b;
                }
                else {
LAB_011c5a7b:
                  *(data_ptr_t *)(local_488 + this->flush_count * 8) = local_480;
                  pWVar11 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                            ::operator->(this_03);
                  iVar8 = (pWVar11->state).current_row_index;
                  psVar6 = (this->update_sel).sel_vector;
                  iVar23 = this->flush_count;
                  uVar2 = iVar23 + 1;
                  this->flush_count = uVar2;
                  psVar6[iVar23] = (int)local_4e0 - (int)iVar8;
                  if (0x7ff < uVar2) {
                    FlushStates(this,gsink);
                  }
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 < (this->orderby_payload).count);
            }
          }
          if ((SortLayout *)local_4d0._16_8_ != (SortLayout *)0x0) {
            RowDataCollectionScanner::~RowDataCollectionScanner
                      ((RowDataCollectionScanner *)local_4d0._16_8_);
            operator_delete((void *)uVar9);
          }
          uVar9 = local_4d0._8_8_;
          local_4d0._16_8_ = (RowDataCollectionScanner *)0x0;
          if ((_Head_base<0UL,_duckdb::RowDataCollection_*,_false>)local_4d0._8_8_ !=
              (_Head_base<0UL,_duckdb::RowDataCollection_*,_false>)0x0) {
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                      ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                       (local_4d0._8_8_ + 0x38));
            ::std::
            vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       *)(uVar9 + 0x20));
            operator_delete((void *)uVar9);
          }
          uVar9 = local_4d0._0_8_;
          local_4d0._8_8_ =
               (tuple<duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>)
               0x0;
          if ((_Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
               )local_4d0._0_8_ != (RowDataCollection *)0x0) {
            ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                      ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                       (local_4d0._0_8_ + 0x38));
            ::std::
            vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       *)(uVar9 + 0x20));
            operator_delete((void *)uVar9);
          }
        }
        LocalSortState::~LocalSortState((LocalSortState *)(local_400 + 0x48));
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                  (local_78);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ::~vector(&local_90);
        if ((_Head_base<0UL,_duckdb::SortedBlock_*,_false>)local_98._M_head_impl !=
            (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)0x0) {
          ::std::default_delete<duckdb::SortedBlock>::operator()
                    ((default_delete<duckdb::SortedBlock> *)&local_98,local_98._M_head_impl);
        }
        local_98._M_head_impl = (SortedBlock *)0x0;
        ::std::
        vector<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>_>_>
        ::~vector(local_490);
        ::std::
        vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   *)(local_2e8 + 0x220));
        if ((pointer)local_2e8._504_8_ != (pointer)0x0) {
          operator_delete((void *)local_2e8._504_8_);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_2e8 + 0x1c8));
        SortLayout::~SortLayout((SortLayout *)(local_2e8 + 0x38));
      }
      iVar19 = iVar19 + 1;
      local_4f0 = local_4f0 + 1;
    } while (iVar19 != count);
  }
  FlushStates(this,gsink);
  pVVar10 = local_478;
  if ((gsink->aggr).bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_2e8._0_8_ = (FunctionData *)0x0;
  }
  else {
    pFVar17 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                        (&(gsink->aggr).bind_data_wrapper);
    local_2e8._0_8_ =
         (pFVar17->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>;
  }
  local_2e8._8_8_ = &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
  local_2e8[0x10] = '\x01';
  (*(gsink->aggr).function.finalize)(&this->statef,(AggregateInputData *)local_2e8,pVVar10,count,0);
  p_Var7 = (gsink->aggr).function.destructor;
  if (p_Var7 != (aggregate_destructor_t)0x0) {
    (*p_Var7)(&this->statef,(AggregateInputData *)local_2e8,count);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_duckdb::WindowNaiveState::EqualRow,_duckdb::WindowNaiveState::HashRow,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_400);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_418);
  return;
}

Assistant:

void WindowNaiveState::Evaluate(const WindowAggregatorGlobalState &gsink, const DataChunk &bounds, Vector &result,
                                idx_t count, idx_t row_idx) {
	const auto &aggr = gsink.aggr;
	auto &filter_mask = gsink.filter_mask;
	const auto types = cursor->chunk.GetTypes();

	auto fdata = FlatVector::GetData<data_ptr_t>(statef);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	HashRow hash_row(*this);
	EqualRow equal_row(*this);
	RowSet row_set(STANDARD_VECTOR_SIZE, hash_row, equal_row);

	WindowAggregator::EvaluateSubFrames(bounds, aggregator.exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = fdata[rid];
		aggr.function.initialize(aggr.function, agg_state);

		//	Reset the DISTINCT hash table
		row_set.clear();

		// 	Sort the input rows by the argument
		if (arg_orderer) {
			auto &context = aggregator.executor.context;
			auto &orders = aggregator.wexpr.arg_orders;
			GlobalSortState global_sort(context, orders, payload_layout);
			LocalSortState local_sort;
			local_sort.Initialize(global_sort, global_sort.buffer_manager);

			idx_t orderby_count = 0;
			auto orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
			for (const auto &frame : frames) {
				for (auto f = frame.start; f < frame.end; ++f) {
					//	FILTER before the ORDER BY
					if (!filter_mask.RowIsValid(f)) {
						continue;
					}

					if (!arg_orderer->RowIsVisible(f) || orderby_count >= STANDARD_VECTOR_SIZE) {
						if (orderby_count) {
							orderby_sort.Reference(arg_orderer->chunk);
							orderby_sort.Slice(orderby_sel, orderby_count);
							orderby_payload.SetCardinality(orderby_count);
							local_sort.SinkChunk(orderby_sort, orderby_payload);
						}
						orderby_count = 0;
						arg_orderer->Seek(f);
					}
					orderby_row[orderby_count] = f;
					orderby_sel.set_index(orderby_count++, arg_orderer->RowOffset(f));
				}
			}
			if (orderby_count) {
				orderby_sort.Reference(arg_orderer->chunk);
				orderby_sort.Slice(orderby_sel, orderby_count);
				orderby_payload.SetCardinality(orderby_count);
				local_sort.SinkChunk(orderby_sort, orderby_payload);
			}

			global_sort.AddLocalState(local_sort);
			if (global_sort.sorted_blocks.empty()) {
				return;
			}
			global_sort.PrepareMergePhase();
			while (global_sort.sorted_blocks.size() > 1) {
				global_sort.InitializeMergeRound();
				MergeSorter merge_sorter(global_sort, global_sort.buffer_manager);
				merge_sorter.PerformInMergeRound();
				global_sort.CompleteMergeRound(false);
			}

			PayloadScanner scanner(global_sort);
			while (scanner.Remaining()) {
				orderby_payload.Reset();
				scanner.Scan(orderby_payload);
				orderby_row = FlatVector::GetData<idx_t>(orderby_payload.data[0]);
				for (idx_t i = 0; i < orderby_payload.size(); ++i) {
					const auto f = orderby_row[i];
					//	Seek to the current position
					if (!cursor->RowIsVisible(f)) {
						//	We need to flush when we cross a chunk boundary
						FlushStates(gsink);
						cursor->Seek(f);
					}

					//	Filter out duplicates
					if (aggr.IsDistinct() && !row_set.insert(f).second) {
						continue;
					}

					pdata[flush_count] = agg_state;
					update_sel[flush_count++] = cursor->RowOffset(f);
					if (flush_count >= STANDARD_VECTOR_SIZE) {
						FlushStates(gsink);
					}
				}
			}
			return;
		}

		//	Just update the aggregate with the unfiltered input rows
		for (const auto &frame : frames) {
			for (auto f = frame.start; f < frame.end; ++f) {
				if (!filter_mask.RowIsValid(f)) {
					continue;
				}

				//	Seek to the current position
				if (!cursor->RowIsVisible(f)) {
					//	We need to flush when we cross a chunk boundary
					FlushStates(gsink);
					cursor->Seek(f);
				}

				//	Filter out duplicates
				if (aggr.IsDistinct() && !row_set.insert(f).second) {
					continue;
				}

				pdata[flush_count] = agg_state;
				update_sel[flush_count++] = cursor->RowOffset(f);
				if (flush_count >= STANDARD_VECTOR_SIZE) {
					FlushStates(gsink);
				}
			}
		}
	});

	//	Flush the final states
	FlushStates(gsink);

	//	Finalise the result aggregates and write to the result
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(statef, aggr_input_data, result, count, 0);

	//	Destruct the result aggregates
	if (aggr.function.destructor) {
		aggr.function.destructor(statef, aggr_input_data, count);
	}
}